

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O3

bool __thiscall
GF2::MI<136UL,_GF2::MOGrevlex<136UL>_>::ReduceClassic
          (MI<136UL,_GF2::MOGrevlex<136UL>_> *this,MP<136UL,_GF2::MOGrevlex<136UL>_> *polyRight)

{
  size_t sVar1;
  undefined8 *******pppppppuVar2;
  undefined8 *******pppppppuVar3;
  _List_node_base **m2;
  bool bVar4;
  int iVar5;
  size_t pos;
  long lVar6;
  long lVar7;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  MP<136UL,_GF2::MOGrevlex<136UL>_> poly;
  undefined8 *******local_88;
  undefined8 *******local_80;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  _List_node_base *local_58;
  MM<136UL> local_48;
  
  local_88 = &local_88;
  local_78 = 0;
  p_Var8 = (polyRight->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>).
           super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var8 == (_List_node_base *)polyRight) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    local_80 = local_88;
    do {
      p_Var9 = (this->
               super_list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
               ).
               super__List_base<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_next;
      if (p_Var9 != (_List_node_base *)this) {
        m2 = &p_Var8[1]._M_next;
LAB_00124ae8:
        iVar5 = MOGrevlex<136UL>::Compare
                          ((MOGrevlex<136UL> *)&this->field_0x18,
                           (MM<136UL> *)
                           (*(size_t *)
                             &((list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                                *)(p_Var9 + 1))->
                              super__List_base<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                           + 0x10),(MM<136UL> *)m2);
        if (iVar5 < 1) {
          sVar1 = *(size_t *)
                   &((list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                      *)(p_Var9 + 1))->
                    super__List_base<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
          ;
          if ((*(ulong *)(sVar1 + 0x10) & ~(ulong)*m2) != 0) goto LAB_00124b3c;
          lVar7 = 3;
          do {
            lVar6 = lVar7;
            if (lVar6 == 5) goto LAB_00124b4c;
            lVar7 = lVar6 + 1;
          } while ((*(ulong *)(sVar1 + lVar6 * 8) & ~(ulong)(&p_Var8->_M_next)[lVar6]) == 0);
          if (lVar6 - 3U < 2) goto LAB_00124b3c;
LAB_00124b4c:
          local_58 = p_Var8[2]._M_next;
          local_68 = *m2;
          uStack_60 = *(undefined8 *)((long)(p_Var8 + 1) + 8);
          lVar7 = 0;
          do {
            (&local_68)[lVar7] = (&local_68)[lVar7] & ~*(ulong *)(sVar1 + 0x10 + lVar7 * 8);
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          local_48.super_WW<136UL>._words[2] = (word)local_58;
          local_48.super_WW<136UL>._words[0]._0_4_ = (undefined4)local_68;
          local_48.super_WW<136UL>._words[0]._4_4_ = local_68._4_4_;
          local_48.super_WW<136UL>._words[1]._0_4_ = (undefined4)uStack_60;
          local_48.super_WW<136UL>._words[1]._4_4_ = uStack_60._4_4_;
          if ((list<GF2::MM<136ul>,std::allocator<GF2::MM<136ul>>> *)(p_Var9 + 1) !=
              (list<GF2::MM<136ul>,std::allocator<GF2::MM<136ul>>> *)&local_88) {
            std::__cxx11::list<GF2::MM<136ul>,std::allocator<GF2::MM<136ul>>>::
            _M_assign_dispatch<std::_List_const_iterator<GF2::MM<136ul>>>
                      ((list<GF2::MM<136ul>,std::allocator<GF2::MM<136ul>>> *)&local_88);
          }
          MP<136UL,_GF2::MOGrevlex<136UL>_>::operator*=
                    ((MP<136UL,_GF2::MOGrevlex<136UL>_> *)&local_88,&local_48);
          MP<136UL,_GF2::MOGrevlex<136UL>_>::SymDiffSplice
                    (polyRight,(MP<136UL,_GF2::MOGrevlex<136UL>_> *)&local_88);
          p_Var8 = (polyRight->super_list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>).
                   super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>._M_impl.
                   _M_node.super__List_node_base._M_next;
          bVar4 = true;
          if (p_Var9 == (_List_node_base *)this) goto LAB_00124bc4;
          goto LAB_00124bc7;
        }
      }
LAB_00124bc4:
      p_Var8 = (((list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *)&p_Var8->_M_next)->
               super__List_base<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>)._M_impl._M_node.
               super__List_node_base._M_next;
LAB_00124bc7:
      pppppppuVar3 = local_88;
    } while (p_Var8 != (_List_node_base *)polyRight);
    while ((undefined8 ********)pppppppuVar3 != &local_88) {
      pppppppuVar2 = (undefined8 *******)*pppppppuVar3;
      operator_delete(pppppppuVar3,0x28);
      pppppppuVar3 = pppppppuVar2;
    }
  }
  return bVar4;
LAB_00124b3c:
  p_Var9 = (((list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
              *)&p_Var9->_M_next)->
           super__List_base<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var9 == (_List_node_base *)this) goto LAB_00124bc4;
  goto LAB_00124ae8;
}

Assistant:

bool ReduceClassic(MP<_n, _O>& polyRight) const
	{	
		assert(IsConsistent(polyRight));
		bool changed = false;
		MP<_n, _O> poly(_order);
		// двигаемся от старших мономов polyRight к младшим
		auto iterMon = polyRight.begin();
		while (iterMon != polyRight.end())
		{
			// двигаемся от младших многочленов системы к старшим
			const_iterator iterPoly = begin();
			for (; iterPoly != end(); ++iterPoly)
			{
				// прекращаем заведомо нерезультативные итерации
				if (_order.Compare(iterPoly->LM(), *iterMon) > 0)
				{
					iterPoly = end();
					break;
				}
				// делим при возможности
				else if (iterPoly->LM() | *iterMon)
				{
					changed = true;
					(poly = *iterPoly) *= *iterMon / iterPoly->LM();
					polyRight.SymDiffSplice(poly);
					iterMon = polyRight.begin();
					break;
				}
			}
			if (iterPoly == end())
				++iterMon;
		}
		return changed;
	}